

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_compressed_data_out(png_structrp png_ptr,compression_state *comp)

{
  png_compression_bufferp local_38;
  png_compression_buffer *next;
  png_byte *ppStack_28;
  png_uint_32 avail;
  png_const_bytep output;
  png_uint_32 output_len;
  compression_state *comp_local;
  png_structrp png_ptr_local;
  
  output._4_4_ = comp->output_len;
  ppStack_28 = comp->output;
  next._4_4_ = 0x400;
  local_38 = png_ptr->zbuffer_list;
  while( true ) {
    if (output._4_4_ < next._4_4_) {
      next._4_4_ = output._4_4_;
    }
    png_write_chunk_data(png_ptr,ppStack_28,(ulong)next._4_4_);
    output._4_4_ = output._4_4_ - next._4_4_;
    if ((output._4_4_ == 0) || (local_38 == (png_compression_bufferp)0x0)) break;
    next._4_4_ = png_ptr->zbuffer_size;
    ppStack_28 = local_38->output;
    local_38 = local_38->next;
  }
  if (output._4_4_ != 0) {
    png_error(png_ptr,"error writing ancillary chunked compressed data");
  }
  return;
}

Assistant:

static void
png_write_compressed_data_out(png_structrp png_ptr, compression_state *comp)
{
   png_uint_32 output_len = comp->output_len;
   png_const_bytep output = comp->output;
   png_uint_32 avail = (sizeof comp->output);
   png_compression_buffer *next = png_ptr->zbuffer_list;

   for (;;)
   {
      if (avail > output_len)
         avail = output_len;

      png_write_chunk_data(png_ptr, output, avail);

      output_len -= avail;

      if (output_len == 0 || next == NULL)
         break;

      avail = png_ptr->zbuffer_size;
      output = next->output;
      next = next->next;
   }

   /* This is an internal error; 'next' must have been NULL! */
   if (output_len > 0)
      png_error(png_ptr, "error writing ancillary chunked compressed data");
}